

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

Expression * __thiscall wasm::Debug::AddrExprMap::getEnd(AddrExprMap *this,BinaryLocation addr)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false> local_28;
  const_iterator iter;
  BinaryLocation addr_local;
  AddrExprMap *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>._M_cur.
  _4_4_ = addr;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
       ::find(&this->endMap,
              (key_type *)
              ((long)&iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
       ::end(&this->endMap);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_wasm::Expression_*>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_wasm::Expression_*>,_false,_false>
                         *)&local_28);
    this_local = (AddrExprMap *)pvVar2->second;
  }
  else {
    this_local = (AddrExprMap *)0x0;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* getEnd(BinaryLocation addr) const {
    auto iter = endMap.find(addr);
    if (iter != endMap.end()) {
      return iter->second;
    }
    return nullptr;
  }